

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::handleError(Parser *this)

{
  iterator this_00;
  Token *pTVar1;
  CAssemblerCommand *this_01;
  long in_RSI;
  
  do {
    this_00._M_node = *(_List_node_base **)(*(long *)(in_RSI + 8) + -0x18);
    if ((_List_node_base *)((TokenizerPosition *)((long)(this_00._M_node + 1) + 8))->it ==
        this_00._M_node) break;
    pTVar1 = Tokenizer::nextToken((Tokenizer *)this_00._M_node);
  } while (pTVar1->type != Separator);
  *(undefined1 *)(in_RSI + 0x79) = 0;
  this_01 = (CAssemblerCommand *)operator_new(0x18);
  this_01->_vptr_CAssemblerCommand = (_func_int **)0x0;
  this_01->FileNum = 0;
  this_01->FileLine = 0;
  *(undefined8 *)&this_01->section = 0;
  CAssemblerCommand::CAssemblerCommand(this_01);
  this_01->_vptr_CAssemblerCommand = (_func_int **)&PTR__CAssemblerCommand_001bc9d0;
  (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this_01;
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::handleError()
{
	// skip the rest of the statement
	while (!atEnd() && nextToken().type != TokenType::Separator);

	clearError();
	return std::make_unique<InvalidCommand>();
}